

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall
btQuantizedBvh::deSerializeDouble
          (btQuantizedBvh *this,btQuantizedBvhDoubleData *quantizedBvhDoubleData)

{
  btOptimizedBvhNode *pbVar1;
  btQuantizedBvhNode *pbVar2;
  btBvhSubtreeInfo *pbVar3;
  btVector3DoubleData *in_RSI;
  long in_RDI;
  int i_2;
  btBvhSubtreeInfoData *memPtr_2;
  int numElem_2;
  int i_1;
  btQuantizedBvhNodeData *memPtr_1;
  int numElem_1;
  int i;
  btOptimizedBvhNodeDoubleData *memPtr;
  int numElem;
  undefined2 in_stack_fffffffffffffef0;
  unsigned_short uVar4;
  undefined2 in_stack_fffffffffffffef2;
  undefined2 in_stack_fffffffffffffef4;
  undefined2 in_stack_fffffffffffffef6;
  btOptimizedBvhNode *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  int iVar5;
  int in_stack_ffffffffffffff10;
  unsigned_short in_stack_ffffffffffffff14;
  unsigned_short in_stack_ffffffffffffff16;
  int local_b4;
  int *local_b0;
  btBvhSubtreeInfo local_a8;
  int local_88;
  int local_84;
  unsigned_short *local_80;
  undefined1 local_78 [16];
  int local_68;
  int local_64;
  double *local_60;
  undefined1 local_54 [64];
  int local_14;
  btVector3DoubleData *local_10;
  
  local_10 = in_RSI;
  btVector3::deSerializeDouble((btVector3 *)(in_RDI + 0x18),in_RSI + 1);
  btVector3::deSerializeDouble((btVector3 *)(in_RDI + 8),local_10);
  btVector3::deSerializeDouble((btVector3 *)(in_RDI + 0x28),local_10 + 2);
  *(undefined4 *)(in_RDI + 0x3c) = *(undefined4 *)local_10[3].m_floats;
  *(bool *)(in_RDI + 0x40) = *(int *)((long)local_10[3].m_floats + 4) != 0;
  local_14 = *(int *)(local_10[3].m_floats + 1);
  memset(local_54,0,0x40);
  btOptimizedBvhNode::btOptimizedBvhNode
            ((btOptimizedBvhNode *)
             CONCAT26(in_stack_fffffffffffffef6,
                      CONCAT24(in_stack_fffffffffffffef4,
                               CONCAT22(in_stack_fffffffffffffef2,in_stack_fffffffffffffef0))));
  btAlignedObjectArray<btOptimizedBvhNode>::resize
            ((btAlignedObjectArray<btOptimizedBvhNode> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
  if (local_14 != 0) {
    local_60 = (double *)local_10[3].m_floats[2];
    for (local_64 = 0; local_64 < local_14; local_64 = local_64 + 1) {
      pbVar1 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      btVector3::deSerializeDouble(&pbVar1->m_aabbMaxOrg,(btVector3DoubleData *)(local_60 + 4));
      pbVar1 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      btVector3::deSerializeDouble(&pbVar1->m_aabbMinOrg,(btVector3DoubleData *)local_60);
      iVar5 = *(int *)((btVector3DoubleData *)((long)local_60 + 0x40))->m_floats;
      pbVar1 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar1->m_escapeIndex = iVar5;
      iVar5 = *(int *)((long)((btVector3DoubleData *)((long)local_60 + 0x40))->m_floats + 4);
      pbVar1 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar1->m_subPart = iVar5;
      iVar5 = *(int *)(((btVector3DoubleData *)((long)local_60 + 0x40))->m_floats + 1);
      pbVar1 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x68),local_64);
      pbVar1->m_triangleIndex = iVar5;
      local_60 = ((btVector3DoubleData *)((long)local_60 + 0x40))->m_floats + 2;
    }
  }
  local_68 = *(int *)((long)local_10[3].m_floats + 0xc);
  memset(local_78,0,0x10);
  btAlignedObjectArray<btQuantizedBvhNode>::resize
            ((btAlignedObjectArray<btQuantizedBvhNode> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),
             in_stack_ffffffffffffff0c,(btQuantizedBvhNode *)in_stack_ffffffffffffff00);
  if (local_68 != 0) {
    local_80 = (unsigned_short *)local_10[3].m_floats[3];
    for (local_84 = 0; local_84 < local_68; local_84 = local_84 + 1) {
      in_stack_ffffffffffffff10 = *(int *)(local_80 + 6);
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_escapeIndexOrTriangleIndex = in_stack_ffffffffffffff10;
      in_stack_ffffffffffffff14 = local_80[3];
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMax[0] = in_stack_ffffffffffffff14;
      in_stack_ffffffffffffff16 = local_80[4];
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMax[1] = in_stack_ffffffffffffff16;
      uVar4 = local_80[5];
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMax[2] = uVar4;
      uVar4 = *local_80;
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMin[0] = uVar4;
      uVar4 = local_80[1];
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMin[1] = uVar4;
      uVar4 = local_80[2];
      pbVar2 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                         ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0xa8),local_84);
      pbVar2->m_quantizedAabbMin[2] = uVar4;
      local_80 = local_80 + 8;
    }
  }
  *(undefined4 *)(in_RDI + 200) = *(undefined4 *)local_10[4].m_floats;
  iVar5 = *(int *)((long)local_10[4].m_floats + 4);
  pbVar3 = (btBvhSubtreeInfo *)(in_RDI + 0xd0);
  local_88 = iVar5;
  btBvhSubtreeInfo::btBvhSubtreeInfo(&local_a8);
  btAlignedObjectArray<btBvhSubtreeInfo>::resize
            ((btAlignedObjectArray<btBvhSubtreeInfo> *)
             CONCAT26(in_stack_ffffffffffffff16,
                      CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10)),iVar5,pbVar3);
  if (local_88 != 0) {
    local_b0 = (int *)local_10[4].m_floats[1];
    for (local_b4 = 0; local_b4 < local_88; local_b4 = local_b4 + 1) {
      uVar4 = *(unsigned_short *)((long)local_b0 + 0xe);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMax[0] = uVar4;
      uVar4 = *(unsigned_short *)(local_b0 + 4);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMax[1] = uVar4;
      uVar4 = *(unsigned_short *)((long)local_b0 + 0x12);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMax[2] = uVar4;
      uVar4 = *(unsigned_short *)(local_b0 + 2);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMin[0] = uVar4;
      uVar4 = *(unsigned_short *)((long)local_b0 + 10);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMin[1] = uVar4;
      uVar4 = *(unsigned_short *)(local_b0 + 3);
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_quantizedAabbMin[2] = uVar4;
      iVar5 = *local_b0;
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_rootNodeIndex = iVar5;
      iVar5 = local_b0[1];
      pbVar3 = btAlignedObjectArray<btBvhSubtreeInfo>::operator[]
                         ((btAlignedObjectArray<btBvhSubtreeInfo> *)(in_RDI + 0xd0),local_b4);
      pbVar3->m_subtreeSize = iVar5;
      local_b0 = local_b0 + 5;
    }
  }
  return;
}

Assistant:

void btQuantizedBvh::deSerializeDouble(struct btQuantizedBvhDoubleData& quantizedBvhDoubleData)
{
	m_bvhAabbMax.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMax);
	m_bvhAabbMin.deSerializeDouble(quantizedBvhDoubleData.m_bvhAabbMin);
	m_bvhQuantization.deSerializeDouble(quantizedBvhDoubleData.m_bvhQuantization);

	m_curNodeIndex = quantizedBvhDoubleData.m_curNodeIndex;
	m_useQuantization = quantizedBvhDoubleData.m_useQuantization!=0;
	
	{
		int numElem = quantizedBvhDoubleData.m_numContiguousLeafNodes;
		m_contiguousNodes.resize(numElem);

		if (numElem)
		{
			btOptimizedBvhNodeDoubleData* memPtr = quantizedBvhDoubleData.m_contiguousNodesPtr;

			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_contiguousNodes[i].m_aabbMaxOrg.deSerializeDouble(memPtr->m_aabbMaxOrg);
				m_contiguousNodes[i].m_aabbMinOrg.deSerializeDouble(memPtr->m_aabbMinOrg);
				m_contiguousNodes[i].m_escapeIndex = memPtr->m_escapeIndex;
				m_contiguousNodes[i].m_subPart = memPtr->m_subPart;
				m_contiguousNodes[i].m_triangleIndex = memPtr->m_triangleIndex;
			}
		}
	}

	{
		int numElem = quantizedBvhDoubleData.m_numQuantizedContiguousNodes;
		m_quantizedContiguousNodes.resize(numElem);
		
		if (numElem)
		{
			btQuantizedBvhNodeData* memPtr = quantizedBvhDoubleData.m_quantizedContiguousNodesPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_quantizedContiguousNodes[i].m_escapeIndexOrTriangleIndex = memPtr->m_escapeIndexOrTriangleIndex;
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_quantizedContiguousNodes[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
			}
		}
	}

	m_traversalMode = btTraversalMode(quantizedBvhDoubleData.m_traversalMode);
	
	{
		int numElem = quantizedBvhDoubleData.m_numSubtreeHeaders;
		m_SubtreeHeaders.resize(numElem);
		if (numElem)
		{
			btBvhSubtreeInfoData* memPtr = quantizedBvhDoubleData.m_subTreeInfoPtr;
			for (int i=0;i<numElem;i++,memPtr++)
			{
				m_SubtreeHeaders[i].m_quantizedAabbMax[0] = memPtr->m_quantizedAabbMax[0] ;
				m_SubtreeHeaders[i].m_quantizedAabbMax[1] = memPtr->m_quantizedAabbMax[1];
				m_SubtreeHeaders[i].m_quantizedAabbMax[2] = memPtr->m_quantizedAabbMax[2];
				m_SubtreeHeaders[i].m_quantizedAabbMin[0] = memPtr->m_quantizedAabbMin[0];
				m_SubtreeHeaders[i].m_quantizedAabbMin[1] = memPtr->m_quantizedAabbMin[1];
				m_SubtreeHeaders[i].m_quantizedAabbMin[2] = memPtr->m_quantizedAabbMin[2];
				m_SubtreeHeaders[i].m_rootNodeIndex = memPtr->m_rootNodeIndex;
				m_SubtreeHeaders[i].m_subtreeSize = memPtr->m_subtreeSize;
			}
		}
	}

}